

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmJsonTokenize(SyStream *pStream,SyToken *pToken,void *pUserData,void *pCtxData)

{
  uchar uVar1;
  sxi32 sVar2;
  ushort **ppuVar3;
  bool bVar4;
  byte *local_50;
  uchar *zIn;
  int c;
  SyString *pStr;
  int *pJsonErr;
  void *pCtxData_local;
  void *pUserData_local;
  SyToken *pToken_local;
  SyStream *pStream_local;
  
  while( true ) {
    bVar4 = false;
    if ((pStream->zText < pStream->zEnd) && (bVar4 = false, *pStream->zText < 0xc0)) {
      ppuVar3 = __ctype_b_loc();
      bVar4 = ((*ppuVar3)[(int)(uint)*pStream->zText] & 0x2000) != 0;
    }
    if (!bVar4) break;
    if (*pStream->zText == '\n') {
      pStream->nLine = pStream->nLine + 1;
    }
    pStream->zText = pStream->zText + 1;
  }
  if (pStream->zText < pStream->zEnd) {
    pToken->nLine = pStream->nLine;
    pToken->pUserData = (void *)0x0;
    (pToken->sData).zString = (char *)pStream->zText;
    (pToken->sData).nByte = 0;
    if (((*pStream->zText < 0xc0) &&
        (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)(uint)*pStream->zText] & 0x400) == 0)) &&
       (*pStream->zText != '_')) {
      if (((((*pStream->zText == '{') || (*pStream->zText == '[')) || (*pStream->zText == '}')) ||
          ((*pStream->zText == ']' || (*pStream->zText == ':')))) || (*pStream->zText == ',')) {
        uVar1 = *pStream->zText;
        if (uVar1 == ',') {
          pToken->nType = 0x400;
        }
        else if (uVar1 == ':') {
          pToken->nType = 0x200;
        }
        else if (uVar1 == '[') {
          pToken->nType = 0x80;
        }
        else if (uVar1 == ']') {
          pToken->nType = 0x100;
        }
        else if (uVar1 == '{') {
          pToken->nType = 0x20;
        }
        else if (uVar1 == '}') {
          pToken->nType = 0x40;
        }
        pStream->zText = pStream->zText + 1;
      }
      else if (*pStream->zText == '\"') {
        pStream->zText = pStream->zText + 1;
        (pToken->sData).zString = (pToken->sData).zString + 1;
        while ((pStream->zText < pStream->zEnd &&
               ((*pStream->zText != '\"' || (pStream->zText[-1] == '\\'))))) {
          if (*pStream->zText == '\n') {
            pStream->nLine = pStream->nLine + 1;
          }
          pStream->zText = pStream->zText + 1;
        }
        if (pStream->zText < pStream->zEnd) {
          pToken->nType = 4;
          pStream->zText = pStream->zText + 1;
        }
        else {
          pToken->nType = 0x1000;
          *(undefined4 *)pUserData = 0xfffffff4;
        }
      }
      else {
        if (((0xbf < *pStream->zText) ||
            (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)(uint)*pStream->zText] & 0x800) == 0)) &&
           ((*pStream->zText != '-' && (*pStream->zText != '+')))) {
          pToken->nType = 0x1000;
          pStream->zText = pStream->zText + 1;
          *(undefined4 *)pUserData = 0xfffffff4;
          return -10;
        }
        pStream->zText = pStream->zText + 1;
        pToken->nType = 0x10;
        while( true ) {
          bVar4 = false;
          if ((pStream->zText < pStream->zEnd) && (bVar4 = false, *pStream->zText < 0xc0)) {
            ppuVar3 = __ctype_b_loc();
            bVar4 = ((*ppuVar3)[(int)(uint)*pStream->zText] & 0x800) != 0;
          }
          if (!bVar4) break;
          pStream->zText = pStream->zText + 1;
        }
        if (pStream->zText < pStream->zEnd) {
          uVar1 = *pStream->zText;
          if (uVar1 == '.') {
            pStream->zText = pStream->zText + 1;
            while( true ) {
              bVar4 = false;
              if ((pStream->zText < pStream->zEnd) && (bVar4 = false, *pStream->zText < 0xc0)) {
                ppuVar3 = __ctype_b_loc();
                bVar4 = ((*ppuVar3)[(int)(uint)*pStream->zText] & 0x800) != 0;
              }
              if (!bVar4) break;
              pStream->zText = pStream->zText + 1;
            }
            if ((pStream->zText < pStream->zEnd) &&
               (((*pStream->zText == 'e' || (*pStream->zText == 'E')) &&
                (pStream->zText = pStream->zText + 1, pStream->zText < pStream->zEnd)))) {
              if ((*pStream->zText == '+') || (*pStream->zText == '-')) {
                pStream->zText = pStream->zText + 1;
              }
              while( true ) {
                bVar4 = false;
                if ((pStream->zText < pStream->zEnd) && (bVar4 = false, *pStream->zText < 0xc0)) {
                  ppuVar3 = __ctype_b_loc();
                  bVar4 = ((*ppuVar3)[(int)(uint)*pStream->zText] & 0x800) != 0;
                }
                if (!bVar4) break;
                pStream->zText = pStream->zText + 1;
              }
            }
          }
          else if (((uVar1 == 'e') || (uVar1 == 'E')) &&
                  (pStream->zText = pStream->zText + 1, pStream->zText < pStream->zEnd)) {
            if ((*pStream->zText == '+') || (*pStream->zText == '-')) {
              pStream->zText = pStream->zText + 1;
            }
            while( true ) {
              bVar4 = false;
              if ((pStream->zText < pStream->zEnd) && (bVar4 = false, *pStream->zText < 0xc0)) {
                ppuVar3 = __ctype_b_loc();
                bVar4 = ((*ppuVar3)[(int)(uint)*pStream->zText] & 0x800) != 0;
              }
              if (!bVar4) break;
              pStream->zText = pStream->zText + 1;
            }
          }
        }
      }
      (pToken->sData).nByte = (int)pStream->zText - (int)(pToken->sData).zString;
      if (pToken->nType == 4) {
        (pToken->sData).nByte = (pToken->sData).nByte - 1;
      }
      pStream_local._4_4_ = 0;
    }
    else {
      if (*pStream->zText < 0xc0) {
        pStream->zText = pStream->zText + 1;
      }
      while( true ) {
        local_50 = pStream->zText;
        if (0xbf < *local_50) {
          do {
            local_50 = local_50 + 1;
            bVar4 = false;
            if (local_50 < pStream->zEnd) {
              bVar4 = (*local_50 & 0xc0) == 0x80;
            }
          } while (bVar4);
        }
        while( true ) {
          bVar4 = false;
          if ((local_50 < pStream->zEnd) && (bVar4 = false, *local_50 < 0xc0)) {
            ppuVar3 = __ctype_b_loc();
            bVar4 = true;
            if (((*ppuVar3)[(int)(uint)*local_50] & 8) == 0) {
              bVar4 = *local_50 == 0x5f;
            }
          }
          if (!bVar4) break;
          local_50 = local_50 + 1;
        }
        if (local_50 == pStream->zText) break;
        pStream->zText = local_50;
      }
      (pToken->sData).nByte = (int)pStream->zText - (int)(pToken->sData).zString;
      pToken->nType = 0x800;
      if (((pToken->sData).nByte == 4) &&
         (sVar2 = SyStrnicmp((pToken->sData).zString,"true",4), sVar2 == 0)) {
        pToken->nType = 1;
      }
      else if (((pToken->sData).nByte == 5) &&
              (sVar2 = SyStrnicmp((pToken->sData).zString,"false",5), sVar2 == 0)) {
        pToken->nType = 2;
      }
      else if (((pToken->sData).nByte == 4) &&
              (sVar2 = SyStrnicmp((pToken->sData).zString,"null",4), sVar2 == 0)) {
        pToken->nType = 8;
      }
      pStream_local._4_4_ = 0;
    }
  }
  else {
    pStream_local._4_4_ = -0x12;
  }
  return pStream_local._4_4_;
}

Assistant:

static sxi32 VmJsonTokenize(SyStream *pStream, SyToken *pToken, void *pUserData, void *pCtxData)
{
	int *pJsonErr = (int *)pUserData;
	SyString *pStr;
	int c;
	/* Ignore leading white spaces */
	while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisSpace(pStream->zText[0]) ){
		/* Advance the stream cursor */
		if( pStream->zText[0] == '\n' ){
			/* Update line counter */
			pStream->nLine++;
		}
		pStream->zText++;
	}
	if( pStream->zText >= pStream->zEnd ){
		/* End of input reached */
		SXUNUSED(pCtxData); /* cc warning */
		return SXERR_EOF;
	}
	/* Record token starting position and line */
	pToken->nLine = pStream->nLine;
	pToken->pUserData = 0;
	pStr = &pToken->sData;
	SyStringInitFromBuf(pStr, pStream->zText, 0);
	if( pStream->zText[0] >= 0xc0 || SyisAlpha(pStream->zText[0]) || pStream->zText[0] == '_' ){
		/* The following code fragment is taken verbatim from the xPP source tree.
		 * xPP is a modern embeddable macro processor with advanced features useful for
		 * application seeking for a production quality, ready to use macro processor.
		 * xPP is a widely used library developed and maintened by Symisc Systems.
		 * You can reach the xPP home page by following this link:
		 * http://xpp.symisc.net/
		 */
		const unsigned char *zIn;
		/* Isolate UTF-8 or alphanumeric stream */
		if( pStream->zText[0] < 0xc0 ){
			pStream->zText++;
		}
		for(;;){
			zIn = pStream->zText;
			if( zIn[0] >= 0xc0 ){
				zIn++;
				/* UTF-8 stream */
				while( zIn < pStream->zEnd && ((zIn[0] & 0xc0) == 0x80) ){
					zIn++;
				}
			}
			/* Skip alphanumeric stream */
			while( zIn < pStream->zEnd && zIn[0] < 0xc0 && (SyisAlphaNum(zIn[0]) || zIn[0] == '_') ){
				zIn++;
			}
			if( zIn == pStream->zText ){
				/* Not an UTF-8 or alphanumeric stream */
				break;
			}
			/* Synchronize pointers */
			pStream->zText = zIn;
		}
		/* Record token length */
		pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
		/* A simple identifier */
		pToken->nType = JSON_TK_ID;
		if( pStr->nByte == sizeof("true") -1 && SyStrnicmp(pStr->zString, "true", sizeof("true")-1) == 0 ){
			/* boolean true */
			pToken->nType = JSON_TK_TRUE;
		}else if( pStr->nByte == sizeof("false") -1 && SyStrnicmp(pStr->zString,"false", sizeof("false")-1) == 0 ){
			/* boolean false */
			pToken->nType = JSON_TK_FALSE;
		}else if( pStr->nByte == sizeof("null") -1 && SyStrnicmp(pStr->zString,"null", sizeof("null")-1) == 0 ){
			/* NULL */
			pToken->nType = JSON_TK_NULL;
		}
		return SXRET_OK;
	}
	if( pStream->zText[0] == '{' || pStream->zText[0] == '[' || pStream->zText[0] == '}' || pStream->zText[0] == ']'
		|| pStream->zText[0] == ':' || pStream->zText[0] == ',' ){
			/* Single character */
			c = pStream->zText[0];
			/* Set token type */
			switch(c){
			case '[': pToken->nType = JSON_TK_OSB;   break;
			case '{': pToken->nType = JSON_TK_OCB;   break;
			case '}': pToken->nType = JSON_TK_CCB;   break;
			case ']': pToken->nType = JSON_TK_CSB;   break;
			case ':': pToken->nType = JSON_TK_COLON; break;
			case ',': pToken->nType = JSON_TK_COMMA; break;
			default:
				break;
			}
			/* Advance the stream cursor */
			pStream->zText++;
	}else if( pStream->zText[0] == '"') {
		/* JSON string */
		pStream->zText++;
		pStr->zString++;
		/* Delimit the string */
		while( pStream->zText < pStream->zEnd ){
			if( pStream->zText[0] == '"' && pStream->zText[-1] != '\\' ){
				break;
			}
			if( pStream->zText[0] == '\n' ){
				/* Update line counter */
				pStream->nLine++;
			}
			pStream->zText++;
		}
		if( pStream->zText >= pStream->zEnd ){
			/* Missing closing '"' */
			pToken->nType = JSON_TK_INVALID;
			*pJsonErr = SXERR_SYNTAX;
		}else{
			pToken->nType = JSON_TK_STR;
			pStream->zText++; /* Jump the closing double quotes */
		}
	}else if( (pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]))
	        || pStream->zText[0] == '-' || pStream->zText[0] == '+' ){
		/* Number */
		pStream->zText++;
		pToken->nType = JSON_TK_NUM;
		while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
			pStream->zText++;
		}
		if( pStream->zText < pStream->zEnd ){
			c = pStream->zText[0];
			if( c == '.' ){
					/* Real number */
					pStream->zText++;
					while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
						pStream->zText++;
					}
					if( pStream->zText < pStream->zEnd ){
						c = pStream->zText[0];
						if( c=='e' || c=='E' ){
							pStream->zText++;
							if( pStream->zText < pStream->zEnd ){
								c = pStream->zText[0];
								if( c =='+' || c=='-' ){
									pStream->zText++;
								}
								while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
									pStream->zText++;
								}
							}
						}
					}					
				}else if( c=='e' || c=='E' ){
					/* Real number */
					pStream->zText++;
					if( pStream->zText < pStream->zEnd ){
						c = pStream->zText[0];
						if( c =='+' || c=='-' ){
							pStream->zText++;
						}
						while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
							pStream->zText++;
						}
					}					
				}
			}
	}else{
		/* Unexpected token */
		pToken->nType = JSON_TK_INVALID;
		/* Advance the stream cursor */
		pStream->zText++;
		*pJsonErr = SXERR_SYNTAX;
		/* Abort processing immediatley */
		return SXERR_ABORT;
	}
	/* record token length */
	pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
	if( pToken->nType == JSON_TK_STR ){
		pStr->nByte--;
	}
	/* Return to the lexer */
	return SXRET_OK;
}